

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O0

Transform * __thiscall sf::View::getTransform(View *this)

{
  double dVar1;
  Transform local_74;
  float local_34;
  float local_30;
  float d;
  float c;
  float b;
  float a;
  float ty;
  float tx;
  float sine;
  float cosine;
  float angle;
  View *this_local;
  
  if ((this->m_transformUpdated & 1U) == 0) {
    sine = (this->m_rotation * 3.1415927) / 180.0;
    _cosine = this;
    dVar1 = std::cos((double)(ulong)(uint)sine);
    tx = SUB84(dVar1,0);
    dVar1 = std::sin((double)(ulong)(uint)sine);
    ty = SUB84(dVar1,0);
    a = -(this->m_center).x * tx + -((this->m_center).y * ty) + (this->m_center).x;
    b = (this->m_center).x * ty + -((this->m_center).y * tx) + (this->m_center).y;
    c = 2.0 / (this->m_size).x;
    d = -2.0 / (this->m_size).y;
    local_30 = -c * (this->m_center).x;
    local_34 = -d * (this->m_center).y;
    Transform::Transform
              (&local_74,c * tx,c * ty,c * a + local_30,-d * ty,d * tx,d * b + local_34,0.0,0.0,1.0)
    ;
    memcpy(&this->m_transform,&local_74,0x40);
    this->m_transformUpdated = true;
  }
  return &this->m_transform;
}

Assistant:

const Transform& View::getTransform() const
{
    // Recompute the matrix if needed
    if (!m_transformUpdated)
    {
        // Rotation components
        float angle  = m_rotation * 3.141592654f / 180.f;
        float cosine = static_cast<float>(std::cos(angle));
        float sine   = static_cast<float>(std::sin(angle));
        float tx     = -m_center.x * cosine - m_center.y * sine + m_center.x;
        float ty     =  m_center.x * sine - m_center.y * cosine + m_center.y;

        // Projection components
        float a =  2.f / m_size.x;
        float b = -2.f / m_size.y;
        float c = -a * m_center.x;
        float d = -b * m_center.y;

        // Rebuild the projection matrix
        m_transform = Transform( a * cosine, a * sine,   a * tx + c,
                                -b * sine,   b * cosine, b * ty + d,
                                 0.f,        0.f,        1.f);
        m_transformUpdated = true;
    }

    return m_transform;
}